

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmProcess.cxx
# Opt level: O2

void __thiscall cmProcess::OnTimeout(cmProcess *this)

{
  State SVar1;
  cmCTestTestProperties *pcVar2;
  uv_process_s *puVar3;
  _Storage<std::chrono::duration<double,_std::ratio<1L,_1L>_>,_true> _Var4;
  
  SVar1 = this->ProcessState;
  this->ProcessState = Expired;
  if (((SVar1 == Executing) && (this->TimeoutReason_ == Normal)) &&
     (pcVar2 = ((this->Runner)._M_t.
                super___uniq_ptr_impl<cmCTestRunTest,_std::default_delete<cmCTestRunTest>_>._M_t.
                super__Tuple_impl<0UL,_cmCTestRunTest_*,_std::default_delete<cmCTestRunTest>_>.
                super__Head_base<0UL,_cmCTestRunTest_*,_false>._M_head_impl)->TestProperties,
     *(bool *)((long)&(pcVar2->TimeoutSignal).
                      super__Optional_base<cmCTestTestHandler::Signal,_false,_false> + 0x28) == true
     )) {
    this->TerminationStyle = Custom;
    puVar3 = ::cm::uv_handle_ptr_::operator_cast_to_uv_process_s_
                       (&(this->Process).super_uv_handle_ptr_<uv_process_s>);
    uv_process_kill(puVar3,*(int *)&(pcVar2->TimeoutSignal).
                                    super__Optional_base<cmCTestTestHandler::Signal,_false,_false>.
                                    _M_payload);
    if (*(bool *)((long)&(pcVar2->TimeoutGracePeriod).
                         super__Optional_base<std::chrono::duration<double,_std::ratio<1L,_1L>_>,_true,_true>
                 + 8) == true) {
      _Var4 = *(_Storage<std::chrono::duration<double,_std::ratio<1L,_1L>_>,_true> *)
               &(pcVar2->TimeoutGracePeriod).
                super__Optional_base<std::chrono::duration<double,_std::ratio<1L,_1L>_>,_true,_true>
      ;
    }
    else {
      _Var4 = (_Storage<std::chrono::duration<double,_std::ratio<1L,_1L>_>,_true>)0x3ff0000000000000
      ;
    }
    if ((this->Timeout).
        super__Optional_base<std::chrono::duration<double,_std::ratio<1L,_1L>_>,_true,_true>.
        _M_payload.super__Optional_payload_base<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>
        ._M_engaged == false) {
      (this->Timeout).
      super__Optional_base<std::chrono::duration<double,_std::ratio<1L,_1L>_>,_true,_true>.
      _M_payload.super__Optional_payload_base<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>.
      _M_engaged = true;
    }
    (this->Timeout).
    super__Optional_base<std::chrono::duration<double,_std::ratio<1L,_1L>_>,_true,_true>._M_payload.
    super__Optional_payload_base<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>._M_payload =
         _Var4;
    StartTimer(this);
    return;
  }
  this->TerminationStyle = Forced;
  if (this->ReadHandleClosed == true) {
    if (this->ProcessHandleClosed != false) {
      return;
    }
  }
  else {
    this->ReadHandleClosed = true;
    ::cm::uv_handle_ptr_base_<uv_pipe_s>::reset((uv_handle_ptr_base_<uv_pipe_s> *)&this->PipeReader)
    ;
    if (this->ProcessHandleClosed != false) {
      Finish(this);
      return;
    }
  }
  puVar3 = ::cm::uv_handle_ptr_base_<uv_process_s>::operator->
                     ((uv_handle_ptr_base_<uv_process_s> *)&this->Process);
  cmsysProcess_KillPID((long)puVar3->pid);
  return;
}

Assistant:

void cmProcess::OnTimeout()
{
  bool const wasExecuting = this->ProcessState == cmProcess::State::Executing;
  this->ProcessState = cmProcess::State::Expired;

  // If the test process is still executing normally, and we timed out because
  // the test timeout was reached, send the custom timeout signal, if any.
  if (wasExecuting && this->TimeoutReason_ == TimeoutReason::Normal) {
    cmCTestTestHandler::cmCTestTestProperties* p =
      this->Runner->GetTestProperties();
    if (p->TimeoutSignal) {
      this->TerminationStyle = Termination::Custom;
      uv_process_kill(this->Process, p->TimeoutSignal->Number);
      if (p->TimeoutGracePeriod) {
        this->Timeout = *p->TimeoutGracePeriod;
      } else {
        static const cmDuration defaultGracePeriod{ 1.0 };
        this->Timeout = defaultGracePeriod;
      }
      this->StartTimer();
      return;
    }
  }

  this->TerminationStyle = Termination::Forced;
  bool const was_still_reading = !this->ReadHandleClosed;
  if (!this->ReadHandleClosed) {
    this->ReadHandleClosed = true;
    this->PipeReader.reset();
  }
  if (!this->ProcessHandleClosed) {
    // Kill the child and let our on-exit handler finish the test.
    cmsysProcess_KillPID(static_cast<unsigned long>(this->Process->pid));
  } else if (was_still_reading) {
    // Our on-exit handler already ran but did not finish the test
    // because we were still reading output.  We've just dropped
    // our read handler, so we need to finish the test now.
    this->Finish();
  }
}